

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTable.cpp
# Opt level: O0

ByteArray * __thiscall
EncodingTable::encodeString
          (ByteArray *__return_storage_ptr__,EncodingTable *this,string *str,bool writeTermination)

{
  size_t sVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  reference pvVar5;
  byte *pbVar6;
  ulong local_80;
  size_t i_1;
  TableEntry *entry_1;
  size_t i;
  TableEntry *entry;
  size_type local_50;
  size_t index;
  size_t pos;
  ByteArray result;
  bool writeTermination_local;
  string *str_local;
  EncodingTable *this_local;
  
  result.allocatedSize_._7_1_ = writeTermination;
  ByteArray::ByteArray((ByteArray *)&pos);
  index = 0;
  do {
    sVar1 = index;
    uVar3 = std::__cxx11::string::size();
    if (uVar3 <= sVar1) {
      if ((result.allocatedSize_._7_1_ & 1) != 0) {
        for (local_80 = 0; local_80 < (this->terminationEntry).hexLen; local_80 = local_80 + 1) {
          pbVar6 = ByteArray::operator[](&this->hexData,(this->terminationEntry).hexPos + local_80);
          ByteArray::appendByte((ByteArray *)&pos,*pbVar6);
        }
      }
      ByteArray::ByteArray(__return_storage_ptr__,(ByteArray *)&pos);
LAB_0019cf26:
      ByteArray::~ByteArray((ByteArray *)&pos);
      return __return_storage_ptr__;
    }
    lVar4 = std::__cxx11::string::c_str();
    bVar2 = Trie::findLongestPrefix(&this->lookup,(char *)(lVar4 + index),&local_50);
    if (!bVar2) {
      ByteArray::ByteArray(__return_storage_ptr__);
      goto LAB_0019cf26;
    }
    pvVar5 = std::vector<EncodingTable::TableEntry,_std::allocator<EncodingTable::TableEntry>_>::
             operator[](&this->entries,local_50);
    for (entry_1 = (TableEntry *)0x0; entry_1 < (TableEntry *)pvVar5->hexLen;
        entry_1 = (TableEntry *)((long)&entry_1->hexPos + 1)) {
      pbVar6 = ByteArray::operator[](&this->hexData,(long)&entry_1->hexPos + pvVar5->hexPos);
      ByteArray::appendByte((ByteArray *)&pos,*pbVar6);
    }
    index = pvVar5->valueLen + index;
  } while( true );
}

Assistant:

ByteArray EncodingTable::encodeString(const std::string& str, bool writeTermination)
{
	ByteArray result;

	size_t pos = 0;
	while (pos < str.size())
	{
		size_t index;
		if (!lookup.findLongestPrefix(str.c_str()+pos,index))
		{
			// error
			return ByteArray();
		}

		TableEntry& entry = entries[index];
		for (size_t i = 0; i < entry.hexLen; i++)
		{
			result.appendByte(hexData[entry.hexPos+i]);
		}

		pos += entry.valueLen;
	}

	if (writeTermination)
	{
		TableEntry& entry = terminationEntry;
		for (size_t i = 0; i < entry.hexLen; i++)
		{
			result.appendByte(hexData[entry.hexPos+i]);
		}
	}

	return result;
}